

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::symbol_sm::payload_t::process
          (payload_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  size_t sVar1;
  optional<bool> *poVar2;
  bool bVar3;
  uchar *__args;
  uchar *puVar4;
  size_type sVar5;
  start_of_frame_1_t *this_00;
  reference_const_type pbVar6;
  size_t sVar7;
  unsigned_long uVar8;
  value_type_conflict1 local_49;
  reference local_48;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
  local_38;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_30 [2];
  optional<bool> *local_20;
  optional<bool> *symbol_local;
  symbol_sm_t *ctx_local;
  payload_t *this_local;
  
  local_20 = symbol;
  symbol_local = (optional<bool> *)ctx;
  ctx_local = (symbol_sm_t *)this;
  bVar3 = boost::operator==(symbol);
  poVar2 = symbol_local;
  if (bVar3) {
    __args = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->payload);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->payload);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->payload);
    std::function<void_(unsigned_char_*,_unsigned_char_*)>::operator()
              ((function<void_(unsigned_char_*,_unsigned_char_*)> *)poVar2,__args,puVar4 + sVar5);
    poVar2 = symbol_local;
    this_00 = (start_of_frame_1_t *)operator_new(0x10);
    memset(this_00,0,0x10);
    start_of_frame_1_t::start_of_frame_1_t(this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
    ::
    unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>>
                *)&local_38,this_00);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
    ::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>,void>
              ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
                *)local_30,&local_38);
    symbol_sm_t::state((symbol_sm_t *)poVar2,local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::~unique_ptr(local_30);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
    ::~unique_ptr(&local_38);
  }
  else {
    pbVar6 = boost::optional<bool>::operator*(local_20);
    bVar3 = *pbVar6;
    this->cnt = this->cnt + 1;
    std::bitset<8UL>::operator[]((bitset<8UL> *)&local_48,(size_t)&this->b);
    std::bitset<8UL>::reference::operator=(&local_48,(bool)(bVar3 & 1));
    std::bitset<8UL>::reference::~reference(&local_48);
    sVar1 = this->cnt;
    sVar7 = std::bitset<8UL>::size(&this->b);
    if (sVar1 == sVar7) {
      uVar8 = std::bitset<8UL>::to_ulong(&this->b);
      local_49 = (value_type_conflict1)uVar8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->payload,&local_49);
      std::bitset<8UL>::reset(&this->b);
      this->cnt = 0;
    }
  }
  return;
}

Assistant:

void
payload_t::process(symbol_sm_t& ctx, const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.callback(payload.data(), payload.data() + payload.size());
        ctx.state(
            std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else
    {
        b[7 - cnt++] = *symbol;
        if (cnt == b.size())
        {
            payload.push_back(uint8_t(b.to_ulong()));
            b.reset();
            cnt = 0;
        }
    }
}